

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O1

Response * jaegertracing::net::http::get(Response *__return_storage_ptr__,URI *uri)

{
  ostream *poVar1;
  ssize_t sVar2;
  system_error *this;
  int *piVar3;
  error_category *__ecat;
  socklen_t in_ECX;
  size_t __nbytes;
  int iVar4;
  __string_type request;
  Socket socket;
  ostringstream oss;
  ostringstream requestStream;
  string local_360;
  Socket local_340;
  string local_330;
  ostream local_310;
  undefined1 local_198 [376];
  
  Socket::OSResource::OSResource(&local_340._osResource);
  local_340._handle = -1;
  local_340._family = -1;
  local_340._type = -1;
  Socket::open(&local_340,(char *)0x2,1);
  Socket::connect((Socket *)local_198,(int)&local_340,(sockaddr *)uri,in_ECX);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"GET ",4);
  URI::target_abi_cxx11_((string *)&local_310,uri);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_310._vptr_basic_ostream,local_310._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," HTTP/1.1\r\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Host: ",6);
  URI::authority_abi_cxx11_(&local_360,uri);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_360._M_dataplus._M_p,
                      CONCAT44(local_360._M_string_length._4_4_,(int)local_360._M_string_length));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\nUser-Agent: jaegertracing/",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"C++-0.5.0",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\r\n\r\n",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if (local_310._vptr_basic_ostream != (_func_int **)&local_310.field_0x10) {
    operator_delete(local_310._vptr_basic_ostream);
  }
  std::__cxx11::stringbuf::str();
  sVar2 = ::write(local_340._handle,local_360._M_dataplus._M_p,
                  CONCAT44(local_360._M_string_length._4_4_,(int)local_360._M_string_length));
  if (sVar2 == (int)local_360._M_string_length) {
    read((int)__return_storage_ptr__,&local_340,__nbytes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    iVar4 = 0x273438;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    Socket::close(&local_340,iVar4);
    Socket::OSResource::~OSResource(&local_340._osResource);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_310);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_310,"Failed to write entire HTTP request",0x23);
  std::__ostream_insert<char,std::char_traits<char>>(&local_310,", uri=",6);
  URI::print<std::ostream>(uri,&local_310);
  std::__ostream_insert<char,std::char_traits<char>>(&local_310,", request=",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (&local_310,local_360._M_dataplus._M_p,
             CONCAT44(local_360._M_string_length._4_4_,(int)local_360._M_string_length));
  this = (system_error *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  iVar4 = *piVar3;
  std::__cxx11::stringbuf::str();
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this,iVar4,__ecat,&local_330);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

Response get(const URI& uri)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    socket.connect(uri);
    std::ostringstream requestStream;
    requestStream << "GET " << uri.target() << " HTTP/1.1\r\n"
                  << "Host: " << uri.authority()
                  << "\r\n"
                     "User-Agent: jaegertracing/"
                  << kJaegerClientVersion << "\r\n\r\n";
    const auto request = requestStream.str();
#ifdef WIN32
    const auto numWritten = ::send(socket.handle(), request.c_str(), request.size(), 0);
#else
    const auto numWritten = ::write(socket.handle(), request.c_str(), request.size());
#endif
    if (numWritten != static_cast<int>(request.size())) {
        std::ostringstream oss;
        oss << "Failed to write entire HTTP request"
            << ", uri=" << uri << ", request=" << request;
        throw std::system_error(errno, std::system_category(), oss.str());
    }

  return read(socket);
}